

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

QString * uniqueItemName(QString *__return_storage_ptr__,QModelIndex *index)

{
  TreeModel *this;
  bool bVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT8 subtype;
  QString subtypeString;
  QString fileText;
  QString itemName;
  QArrayDataPointer<char16_t> local_f0;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QString itemText;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  
  bVar1 = QModelIndex::isValid(index);
  if (!bVar1) {
    QString::QString(__return_storage_ptr__,"InvalidIndex");
    return __return_storage_ptr__;
  }
  this = (TreeModel *)index->m;
  TreeModel::name(&itemName,this,index);
  TreeModel::text(&itemText,this,index);
  (__return_storage_ptr__->d).d = itemName.d.d;
  (__return_storage_ptr__->d).ptr = itemName.d.ptr;
  (__return_storage_ptr__->d).size = itemName.d.size;
  if (itemName.d.d != (Data *)0x0) {
    LOCK();
    ((itemName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((itemName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar2 = TreeModel::type(this,index);
  if ((bVar2 - 0x4f < 6) || (bVar2 == 0x42)) {
    if (itemText.d.size == 0) {
      subtypeString.d.d = itemName.d.d;
      subtypeString.d.ptr = itemName.d.ptr;
      subtypeString.d.size = itemName.d.size;
      if (itemName.d.d != (Data *)0x0) {
        LOCK();
        ((itemName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((itemName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      operator+(&fileText,&itemName,(QChar)0x5f);
      operator+(&subtypeString,&fileText,&itemText);
    }
    QString::operator=(__return_storage_ptr__,(QString *)&subtypeString);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&subtypeString.d);
    if (itemText.d.size == 0) goto LAB_0014aa48;
  }
  else {
    if (bVar2 != 0x43) goto LAB_0014aa48;
    TreeModel::findParentOfType((QModelIndex *)&subtypeString,this,index,'B');
    TreeModel::text(&fileText,this,(QModelIndex *)&subtypeString);
    if (fileText.d.size == 0) {
      TreeModel::name((QString *)&local_c0,this,(QModelIndex *)&subtypeString);
    }
    else {
      TreeModel::name((QString *)&local_60,this,(QModelIndex *)&subtypeString);
      operator+((QString *)&local_48,(QString *)&local_60,(QChar)0x5f);
      operator+((QString *)&local_c0,(QString *)&local_48,&fileText);
    }
    QString::operator=(__return_storage_ptr__,(QString *)&local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    if (fileText.d.size != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    UVar3 = TreeModel::subtype(this,index);
    if ((UVar3 == '\x02') || (UVar3 = TreeModel::subtype(this,index), UVar3 == '\x18')) {
      TreeModel::name((QString *)&local_f0,this,index);
      operator+((QString *)&local_d8,(QString *)&local_f0,(QChar)0x5f);
      operator+((QString *)&local_c0,(QString *)&local_d8,__return_storage_ptr__);
      QString::operator=(__return_storage_ptr__,(QString *)&local_c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&fileText.d);
LAB_0014aa48:
  UVar3 = TreeModel::type(this,index);
  subtype = TreeModel::subtype(this,index);
  itemSubtypeToUString(&subtypeString,UVar3,subtype);
  UVar3 = TreeModel::type(this,index);
  itemTypeToUString((QString *)&local_78,UVar3);
  if (subtypeString.d.size == 0) {
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
  }
  else {
    operator+((QString *)&local_a8,(QChar)0x5f,&subtypeString);
  }
  operator+((QString *)&local_f0,(QString *)&local_78,(QString *)&local_a8);
  operator+((QString *)&local_d8,(QString *)&local_f0,(QChar)0x5f);
  operator+((QString *)&local_c0,(QString *)&local_d8,__return_storage_ptr__);
  QString::operator=(__return_storage_ptr__,(QString *)&local_c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  fixFileName(__return_storage_ptr__,true);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&subtypeString.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&itemText.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&itemName.d);
  return __return_storage_ptr__;
}

Assistant:

UString uniqueItemName(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return UString("InvalidIndex");
    
    // Get model from index
    const TreeModel* model = (const TreeModel*)index.model();
    
    // Construct the name
    UString itemName = model->name(index);
    UString itemText = model->text(index);
    
    // Default name
    UString name = itemName;
    switch (model->type(index)) {
        case Types::NvarEntry:
        case Types::VssEntry:
        case Types::SysFEntry:
        case Types::EvsaEntry:
        case Types::PhoenixFlashMapEntry:
        case Types::InsydeFlashDeviceMapEntry:
        case Types::File:
            name = itemText.isEmpty() ? itemName : itemName + '_' + itemText;
            break;
        case Types::Section: {
            // Get parent file name
            UModelIndex fileIndex = model->findParentOfType(index, Types::File);
            UString fileText = model->text(fileIndex);
            name = fileText.isEmpty() ? model->name(fileIndex) : model->name(fileIndex) + '_' + fileText;
            
            // Special case of GUIDed sections
            if (model->subtype(index) == EFI_SECTION_GUID_DEFINED || model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID) {
                name = model->name(index) +'_' + name;
            }
        } break;
    }
    
    // Populate subtypeString
    UString subtypeString = itemSubtypeToUString(model->type(index), model->subtype(index));
    
    // Create final name
    name = itemTypeToUString(model->type(index))
    + (subtypeString.length() ? ('_' + subtypeString) : UString())
    + '_' + name;
    
    fixFileName(name, true);
    
    return name;
}